

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::FastZ32R2
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  char cVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  RepeatedField<int> *this;
  uint *puVar5;
  ulong uVar6;
  char *pcVar7;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar8;
  
  if (data.field_0._0_2_ != 0) {
    pcVar7 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar7;
  }
  this = RefAt<google::protobuf::RepeatedField<int>>(msg,(ulong)data.field_0 >> 0x30);
  uVar2 = *(ushort *)ptr;
  do {
    pcVar7 = (char *)(long)(char)*(ushort *)((long)ptr + 2);
    if ((long)pcVar7 < 0) {
      uVar6 = (long)*(char *)((long)ptr + 3) << 7 | 0x7f;
      if ((long)uVar6 < 0) {
        aVar8.data = (long)(char)*(ushort *)((long)ptr + 4) << 0xe | 0x3fff;
        if ((long)aVar8 < 0) {
          uVar6 = ((long)*(char *)((long)ptr + 5) << 0x15 | 0x1fffffU) & uVar6;
          if ((long)uVar6 < 0) {
            aVar8.data = ((long)(char)*(ushort *)((long)ptr + 6) << 0x1c | 0xfffffffU) & aVar8.data;
            if ((long)aVar8 < 0) {
              if (*(char *)((long)ptr + 7) < '\0') {
                if ((char)*(ushort *)((long)ptr + 8) < '\0') {
                  if (*(char *)((long)ptr + 9) < '\0') {
                    if ((char)*(ushort *)((long)ptr + 10) < '\0') {
                      cVar1 = *(char *)((long)ptr + 0xb);
                      ptr = (char *)((long)ptr + 0xc);
                      if ((cVar1 != '\x01') && (cVar1 < '\0')) {
                        pcVar7 = Error(msg,pcVar7,(ParseContext *)CONCAT71(0xffffffffffffff,cVar1),
                                       (TcFieldData)aVar8,table,hasbits);
                        return pcVar7;
                      }
                    }
                    else {
                      ptr = (char *)((long)ptr + 0xb);
                    }
                  }
                  else {
                    ptr = (char *)((long)ptr + 10);
                  }
                }
                else {
                  ptr = (char *)((long)ptr + 9);
                }
              }
              else {
                ptr = (char *)((long)ptr + 8);
              }
            }
            else {
              ptr = (char *)((long)ptr + 7);
            }
          }
          else {
            ptr = (char *)((long)ptr + 6);
          }
        }
        else {
          ptr = (char *)((long)ptr + 5);
        }
        uVar6 = aVar8.data & uVar6;
      }
      else {
        ptr = (char *)((long)ptr + 4);
      }
      pcVar7 = (char *)((ulong)pcVar7 & uVar6);
    }
    else {
      ptr = (char *)((long)ptr + 3);
    }
    RepeatedField<int>::Add(this,-((uint)pcVar7 & 1) ^ (uint)((ulong)pcVar7 >> 1) & 0x7fffffff);
    if ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr) {
      if ((ulong)table->has_bits_offset != 0) {
        puVar5 = RefAt<unsigned_int>(msg,(ulong)table->has_bits_offset);
        *puVar5 = *puVar5 | (uint)hasbits;
      }
      return (char *)(ushort *)ptr;
    }
    uVar3 = *(ushort *)ptr;
  } while (uVar3 == uVar2);
  uVar4 = (uint)table->fast_idx_mask & (uint)uVar3;
  if ((uVar4 & 7) == 0) {
    uVar6 = (ulong)(uVar4 & 0xfffffff8);
    pcVar7 = (char *)(**(code **)(&table[1].has_bits_offset + uVar6))
                               (msg,ptr,ctx,
                                (ulong)uVar3 ^ *(ulong *)(&table[1].fast_idx_mask + uVar6 * 2),table
                                ,hasbits);
    return pcVar7;
  }
  protobuf_assumption_failed
            ("(idx & 7) == 0",
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
             ,0x452);
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastZ32R2(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return RepeatedVarint<int32_t, uint16_t, true>(
      PROTOBUF_TC_PARAM_PASS);
}